

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_bls_16(void)

{
  uint uVar1;
  uint addr_in;
  
  if (((m68ki_cpu.c_flag._1_1_ & 1) == 0) && (m68ki_cpu.not_z_flag != 0)) {
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    m68ki_remaining_cycles = m68ki_remaining_cycles - m68ki_cpu.cyc_bcc_notake_w;
  }
  else {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    addr_in = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    uVar1 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
    m68ki_cpu.pc = ((int)(short)uVar1 + m68ki_cpu.pc) - 2;
  }
  return;
}

Assistant:

static void m68k_op_bls_16(void)
{
	if(COND_LS())
	{
		uint offset = OPER_I_16();
		REG_PC -= 2;
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		m68ki_branch_16(offset);
		return;
	}
	REG_PC += 2;
	USE_CYCLES(CYC_BCC_NOTAKE_W);
}